

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_csp_enc.c
# Opt level: O2

int ImportYUVAFromRGBA(uint8_t *r_ptr,uint8_t *g_ptr,uint8_t *b_ptr,uint8_t *a_ptr,int step,
                      int rgb_stride,float dithering,int use_iterative_conversion,
                      WebPPicture *picture)

{
  int width;
  uint height;
  int iVar1;
  uint8_t *v_ptr;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  SharpYuvConversionMatrix *yuv_matrix;
  uint16_t *dst;
  long lVar7;
  _func_void_uint8_t_ptr_uint8_t_ptr_int **pp_Var8;
  uint8_t *puVar9;
  long lVar10;
  uint8_t *puVar11;
  uint16_t *puVar12;
  int *piVar13;
  bool bVar14;
  double dVar15;
  uint8_t *local_1c0;
  uint8_t *local_1a8;
  VP8Random *local_190;
  uint8_t *local_168;
  uint8_t *local_148;
  uint8_t *local_140;
  VP8Random base_rg;
  
  width = picture->width;
  height = picture->height;
  iVar3 = CheckNonOpaque(a_ptr,width,height,step,rgb_stride);
  picture->colorspace = (uint)(iVar3 != 0) << 2;
  picture->use_argb = 0;
  iVar4 = WebPPictureAllocYUVA(picture);
  if (iVar4 == 0) {
    iVar4 = 0;
  }
  else if (((use_iterative_conversion == 0) || (width < 4)) || ((int)height < 4)) {
    iVar4 = width + 1 >> 1;
    dst = (uint16_t *)WebPSafeMalloc((long)(iVar4 * 4),2);
    local_1a8 = picture->y;
    local_140 = picture->u;
    local_168 = picture->v;
    local_148 = picture->a;
    bVar2 = dithering <= 0.0;
    if (bVar2) {
      local_190 = (VP8Random *)0x0;
    }
    else {
      local_190 = &base_rg;
      VP8InitRandom(local_190,dithering);
    }
    WebPInitConvertARGBToYUV();
    iVar5 = pthread_mutex_lock((pthread_mutex_t *)InitGammaTables_InitGammaTables_body_lock);
    if (iVar5 == 0) {
      if (((VP8CPUInfo)InitGammaTables_InitGammaTables_body_last_cpuinfo_used != VP8GetCPUInfo) &&
         (kGammaTablesOk == 0)) {
        puVar12 = kGammaToLinearTab;
        for (lVar10 = 0; lVar10 != 0x100; lVar10 = lVar10 + 1) {
          dVar15 = pow((double)(int)lVar10 * 0.00392156862745098,0.8);
          *puVar12 = (uint16_t)(int)(dVar15 * 4095.0 + 0.5);
          puVar12 = puVar12 + 1;
        }
        piVar13 = kLinearToGammaTab;
        for (lVar10 = 0; lVar10 != 0x21; lVar10 = lVar10 + 1) {
          dVar15 = pow((double)(int)lVar10 * 0.03125763125763126,1.25);
          *piVar13 = (int)(dVar15 * 255.0 + 0.5);
          piVar13 = piVar13 + 1;
        }
        kGammaTablesOk = 1;
      }
      InitGammaTables_InitGammaTables_body_last_cpuinfo_used = VP8GetCPUInfo;
      pthread_mutex_unlock((pthread_mutex_t *)InitGammaTables_InitGammaTables_body_lock);
    }
    if (dst == (uint16_t *)0x0) {
      iVar4 = WebPEncodingSetError(picture,VP8_ENC_ERROR_OUT_OF_MEMORY);
    }
    else {
      iVar5 = (int)height >> 1;
      lVar7 = (long)(rgb_stride * 2);
      lVar10 = 0;
      if (iVar3 != 0) {
        lVar10 = lVar7;
      }
      if (iVar5 < 1) {
        iVar5 = 0;
      }
      puVar11 = r_ptr;
      local_1c0 = b_ptr;
      while (bVar14 = iVar5 != 0, iVar5 = iVar5 + -1, bVar14) {
        if (!bVar2 || step != 3) {
          ConvertRowToY(puVar11,g_ptr,local_1c0,step,local_1a8,width,local_190);
          ConvertRowToY(puVar11 + rgb_stride,g_ptr + rgb_stride,local_1c0 + rgb_stride,step,
                        local_1a8 + picture->y_stride,width,local_190);
        }
        else {
          if (r_ptr < b_ptr) {
            pp_Var8 = &WebPConvertRGB24ToY;
            puVar9 = puVar11;
          }
          else {
            pp_Var8 = &WebPConvertBGR24ToY;
            puVar9 = local_1c0;
          }
          (**pp_Var8)(puVar9,local_1a8,width);
          (**pp_Var8)(puVar9 + rgb_stride,local_1a8 + picture->y_stride,width);
        }
        iVar1 = picture->y_stride;
        if (iVar3 == 0) {
LAB_0011f2ba:
          AccumulateRGB(puVar11,g_ptr,local_1c0,step,rgb_stride,dst,width);
        }
        else {
          iVar6 = (*WebPExtractAlpha)(a_ptr,rgb_stride,width,2,local_148,picture->a_stride);
          local_148 = local_148 + (long)picture->a_stride * 2;
          if (iVar6 != 0) goto LAB_0011f2ba;
          AccumulateRGBA(puVar11,g_ptr,local_1c0,a_ptr,rgb_stride,dst,width);
        }
        if (local_190 == (VP8Random *)0x0) {
          (*WebPConvertRGBA32ToUV)(dst,local_140,local_168,iVar4);
        }
        else {
          ConvertRowsToUV(dst,local_140,local_168,iVar4,local_190);
        }
        local_1a8 = local_1a8 + (long)iVar1 * 2;
        local_140 = local_140 + picture->uv_stride;
        local_168 = local_168 + picture->uv_stride;
        puVar11 = puVar11 + lVar7;
        local_1c0 = local_1c0 + lVar7;
        g_ptr = g_ptr + lVar7;
        a_ptr = a_ptr + lVar10;
      }
      if ((height & 1) != 0) {
        if (!bVar2 || step != 3) {
          ConvertRowToY(puVar11,g_ptr,local_1c0,step,local_1a8,width,local_190);
        }
        else {
          if (puVar11 < local_1c0) {
            pp_Var8 = &WebPConvertRGB24ToY;
            puVar9 = puVar11;
          }
          else {
            pp_Var8 = &WebPConvertBGR24ToY;
            puVar9 = local_1c0;
          }
          (**pp_Var8)(puVar9,local_1a8,width);
        }
        if ((iVar3 == 0) || (iVar3 = (*WebPExtractAlpha)(a_ptr,0,width,1,local_148,0), iVar3 != 0))
        {
          AccumulateRGB(puVar11,g_ptr,local_1c0,step,0,dst,width);
        }
        else {
          AccumulateRGBA(puVar11,g_ptr,local_1c0,a_ptr,0,dst,width);
        }
        if (local_190 == (VP8Random *)0x0) {
          (*WebPConvertRGBA32ToUV)(dst,local_140,local_168,iVar4);
        }
        else {
          ConvertRowsToUV(dst,local_140,local_168,iVar4,local_190);
        }
      }
      WebPSafeFree(dst);
      iVar4 = 1;
    }
  }
  else {
    SharpYuvInit(VP8GetCPUInfo);
    puVar11 = picture->y;
    iVar4 = picture->y_stride;
    puVar9 = picture->u;
    iVar5 = picture->uv_stride;
    v_ptr = picture->v;
    iVar1 = picture->width;
    iVar6 = picture->height;
    yuv_matrix = SharpYuvGetConversionMatrix(kSharpYuvMatrixWebp);
    iVar5 = SharpYuvConvert(r_ptr,g_ptr,b_ptr,step,rgb_stride,8,puVar11,iVar4,puVar9,iVar5,v_ptr,
                            iVar5,8,iVar1,iVar6,yuv_matrix);
    iVar4 = 1;
    if (iVar5 == 0) {
      iVar5 = WebPEncodingSetError(picture,VP8_ENC_ERROR_OUT_OF_MEMORY);
      if (iVar5 == 0 || iVar3 == 0) {
        return (uint)(iVar5 != 0);
      }
    }
    else if (iVar3 == 0) {
      return 1;
    }
    (*WebPExtractAlpha)(a_ptr,rgb_stride,width,height,picture->a,picture->a_stride);
  }
  return iVar4;
}

Assistant:

static int ImportYUVAFromRGBA(const uint8_t* r_ptr,
                              const uint8_t* g_ptr,
                              const uint8_t* b_ptr,
                              const uint8_t* a_ptr,
                              int step,         // bytes per pixel
                              int rgb_stride,   // bytes per scanline
                              float dithering,
                              int use_iterative_conversion,
                              WebPPicture* const picture) {
  int y;
  const int width = picture->width;
  const int height = picture->height;
  const int has_alpha = CheckNonOpaque(a_ptr, width, height, step, rgb_stride);
  const int is_rgb = (r_ptr < b_ptr);  // otherwise it's bgr

  picture->colorspace = has_alpha ? WEBP_YUV420A : WEBP_YUV420;
  picture->use_argb = 0;

  // disable smart conversion if source is too small (overkill).
  if (width < kMinDimensionIterativeConversion ||
      height < kMinDimensionIterativeConversion) {
    use_iterative_conversion = 0;
  }

  if (!WebPPictureAllocYUVA(picture)) {
    return 0;
  }
  if (has_alpha) {
    assert(step == 4);
#if defined(USE_GAMMA_COMPRESSION) && defined(USE_INVERSE_ALPHA_TABLE)
    assert(kAlphaFix + GAMMA_FIX <= 31);
#endif
  }

  if (use_iterative_conversion) {
    SharpYuvInit(VP8GetCPUInfo);
    if (!PreprocessARGB(r_ptr, g_ptr, b_ptr, step, rgb_stride, picture)) {
      return 0;
    }
    if (has_alpha) {
      WebPExtractAlpha(a_ptr, rgb_stride, width, height,
                       picture->a, picture->a_stride);
    }
  } else {
    const int uv_width = (width + 1) >> 1;
    int use_dsp = (step == 3);  // use special function in this case
    // temporary storage for accumulated R/G/B values during conversion to U/V
    uint16_t* const tmp_rgb =
        (uint16_t*)WebPSafeMalloc(4 * uv_width, sizeof(*tmp_rgb));
    uint8_t* dst_y = picture->y;
    uint8_t* dst_u = picture->u;
    uint8_t* dst_v = picture->v;
    uint8_t* dst_a = picture->a;

    VP8Random base_rg;
    VP8Random* rg = NULL;
    if (dithering > 0.) {
      VP8InitRandom(&base_rg, dithering);
      rg = &base_rg;
      use_dsp = 0;   // can't use dsp in this case
    }
    WebPInitConvertARGBToYUV();
    InitGammaTables();

    if (tmp_rgb == NULL) {
      return WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
    }

    // Downsample Y/U/V planes, two rows at a time
    for (y = 0; y < (height >> 1); ++y) {
      int rows_have_alpha = has_alpha;
      if (use_dsp) {
        if (is_rgb) {
          WebPConvertRGB24ToY(r_ptr, dst_y, width);
          WebPConvertRGB24ToY(r_ptr + rgb_stride,
                              dst_y + picture->y_stride, width);
        } else {
          WebPConvertBGR24ToY(b_ptr, dst_y, width);
          WebPConvertBGR24ToY(b_ptr + rgb_stride,
                              dst_y + picture->y_stride, width);
        }
      } else {
        ConvertRowToY(r_ptr, g_ptr, b_ptr, step, dst_y, width, rg);
        ConvertRowToY(r_ptr + rgb_stride,
                      g_ptr + rgb_stride,
                      b_ptr + rgb_stride, step,
                      dst_y + picture->y_stride, width, rg);
      }
      dst_y += 2 * picture->y_stride;
      if (has_alpha) {
        rows_have_alpha &= !WebPExtractAlpha(a_ptr, rgb_stride, width, 2,
                                             dst_a, picture->a_stride);
        dst_a += 2 * picture->a_stride;
      }
      // Collect averaged R/G/B(/A)
      if (!rows_have_alpha) {
        AccumulateRGB(r_ptr, g_ptr, b_ptr, step, rgb_stride, tmp_rgb, width);
      } else {
        AccumulateRGBA(r_ptr, g_ptr, b_ptr, a_ptr, rgb_stride, tmp_rgb, width);
      }
      // Convert to U/V
      if (rg == NULL) {
        WebPConvertRGBA32ToUV(tmp_rgb, dst_u, dst_v, uv_width);
      } else {
        ConvertRowsToUV(tmp_rgb, dst_u, dst_v, uv_width, rg);
      }
      dst_u += picture->uv_stride;
      dst_v += picture->uv_stride;
      r_ptr += 2 * rgb_stride;
      b_ptr += 2 * rgb_stride;
      g_ptr += 2 * rgb_stride;
      if (has_alpha) a_ptr += 2 * rgb_stride;
    }
    if (height & 1) {    // extra last row
      int row_has_alpha = has_alpha;
      if (use_dsp) {
        if (r_ptr < b_ptr) {
          WebPConvertRGB24ToY(r_ptr, dst_y, width);
        } else {
          WebPConvertBGR24ToY(b_ptr, dst_y, width);
        }
      } else {
        ConvertRowToY(r_ptr, g_ptr, b_ptr, step, dst_y, width, rg);
      }
      if (row_has_alpha) {
        row_has_alpha &= !WebPExtractAlpha(a_ptr, 0, width, 1, dst_a, 0);
      }
      // Collect averaged R/G/B(/A)
      if (!row_has_alpha) {
        // Collect averaged R/G/B
        AccumulateRGB(r_ptr, g_ptr, b_ptr, step, /* rgb_stride = */ 0,
                      tmp_rgb, width);
      } else {
        AccumulateRGBA(r_ptr, g_ptr, b_ptr, a_ptr, /* rgb_stride = */ 0,
                       tmp_rgb, width);
      }
      if (rg == NULL) {
        WebPConvertRGBA32ToUV(tmp_rgb, dst_u, dst_v, uv_width);
      } else {
        ConvertRowsToUV(tmp_rgb, dst_u, dst_v, uv_width, rg);
      }
    }
    WebPSafeFree(tmp_rgb);
  }
  return 1;
}